

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O0

void __thiscall
swrenderer::DrawColumnPalCommand::Execute(DrawColumnPalCommand *this,DrawerThread *thread)

{
  int iVar1;
  int iVar2;
  int pitch_00;
  uchar *dest_00;
  uint8_t *puVar3;
  uint8_t *puVar4;
  int iVar5;
  uint8_t *source;
  uint8_t *colormap;
  int pitch;
  fixed_t fracstep;
  fixed_t frac;
  uint8_t *dest;
  int count;
  DrawerThread *thread_local;
  DrawColumnPalCommand *this_local;
  
  dest_00 = (this->super_PalColumnCommand)._dest;
  iVar1 = (this->super_PalColumnCommand)._iscale;
  iVar2 = (this->super_PalColumnCommand)._texturefrac;
  dest._4_4_ = DrawerThread::count_for_thread
                         (thread,(this->super_PalColumnCommand).super_DrawerCommand._dest_y,
                          *(int *)&(this->super_PalColumnCommand).super_DrawerCommand.field_0xc);
  if (0 < dest._4_4_) {
    pitch_00 = (this->super_PalColumnCommand)._pitch;
    _fracstep = DrawerThread::dest_for_thread<unsigned_char>
                          (thread,(this->super_PalColumnCommand).super_DrawerCommand._dest_y,
                           pitch_00,dest_00);
    iVar5 = DrawerThread::skipped_by_thread
                      (thread,(this->super_PalColumnCommand).super_DrawerCommand._dest_y);
    pitch = iVar1 * iVar5 + iVar2;
    iVar2 = thread->num_cores;
    iVar5 = thread->num_cores;
    puVar3 = (this->super_PalColumnCommand)._colormap;
    puVar4 = (this->super_PalColumnCommand)._source;
    do {
      *_fracstep = puVar3[puVar4[pitch >> 0x10]];
      _fracstep = _fracstep + iVar5 * pitch_00;
      pitch = iVar2 * iVar1 + pitch;
      dest._4_4_ = dest._4_4_ + -1;
    } while (dest._4_4_ != 0);
  }
  return;
}

Assistant:

void DrawColumnPalCommand::Execute(DrawerThread *thread)
	{
		int count;
		uint8_t *dest;
		fixed_t frac;
		fixed_t fracstep;

		count = _count;

		// Framebuffer destination address.
		dest = _dest;

		// Determine scaling,
		//	which is the only mapping to be done.
		fracstep = _iscale;
		frac = _texturefrac;

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		int pitch = _pitch;
		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		frac += fracstep * thread->skipped_by_thread(_dest_y);
		fracstep *= thread->num_cores;
		pitch *= thread->num_cores;

		// [RH] Get local copies of these variables so that the compiler
		//		has a better chance of optimizing this well.
		const uint8_t *colormap = _colormap;
		const uint8_t *source = _source;

		// Inner loop that does the actual texture mapping,
		//	e.g. a DDA-lile scaling.
		// This is as fast as it gets.
		do
		{
			// Re-map color indices from wall texture column
			//	using a lighting/special effects LUT.
			*dest = colormap[source[frac >> FRACBITS]];

			dest += pitch;
			frac += fracstep;

		} while (--count);
	}